

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O3

void __thiscall
jrtplib::RTPUDPv6Transmitter::RTPUDPv6Transmitter(RTPUDPv6Transmitter *this,RTPMemoryManager *mgr)

{
  (this->super_RTPTransmitter).super_RTPMemoryObject.mgr = mgr;
  timeinit = timeinit + 1;
  (this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPUDPv6Transmitter_0013c2b0;
  (this->localIPs).super__List_base<in6_addr,_std::allocator<in6_addr>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->localIPs;
  (this->localIPs).super__List_base<in6_addr,_std::allocator<in6_addr>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->localIPs;
  (this->localIPs).super__List_base<in6_addr,_std::allocator<in6_addr>_>._M_impl._M_node._M_size = 0
  ;
  (this->destinations).super_RTPMemoryObject.mgr = mgr;
  (this->destinations).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPHashTable_0013c450;
  memset((this->destinations).table,0,0x103f8);
  (this->destinations).memorytype = 0xd;
  (this->multicastgroups).super_RTPMemoryObject.mgr = mgr;
  (this->multicastgroups).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPHashTable_0013c488;
  memset((this->multicastgroups).table,0,0x103f8);
  (this->multicastgroups).memorytype = 0xe;
  (this->rawpacketlist).
  super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->rawpacketlist;
  (this->rawpacketlist).
  super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->rawpacketlist;
  (this->rawpacketlist).
  super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>._M_impl.
  _M_node._M_size = 0;
  (this->acceptignoreinfo).super_RTPMemoryObject.mgr = mgr;
  (this->acceptignoreinfo).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPKeyHashTable_0013c4c0;
  memset((this->acceptignoreinfo).table,0,0x103f8);
  (this->acceptignoreinfo).memorytype = 0xb;
  RTPAbortDescriptors::RTPAbortDescriptors(&this->m_abortDesc);
  this->init = false;
  this->created = false;
  return;
}

Assistant:

RTPUDPv6Transmitter::RTPUDPv6Transmitter(RTPMemoryManager *mgr) : RTPTransmitter(mgr),
								  destinations(GetMemoryManager(),RTPMEM_TYPE_CLASS_DESTINATIONLISTHASHELEMENT),
								  multicastgroups(GetMemoryManager(),RTPMEM_TYPE_CLASS_MULTICASTHASHELEMENT),
								  acceptignoreinfo(GetMemoryManager(),RTPMEM_TYPE_CLASS_ACCEPTIGNOREHASHELEMENT)
{
	created = false;
	init = false;
}